

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int check_next2(LexState *ls,char *set)

{
  size_t sVar1;
  byte *pbVar2;
  uint local_24;
  char *set_local;
  LexState *ls_local;
  
  if (set[2] == '\0') {
    if ((ls->current == (int)*set) || (ls->current == (int)set[1])) {
      save(ls,ls->current);
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_24 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_24 = (uint)*pbVar2;
      }
      ls->current = local_24;
      ls_local._4_4_ = 1;
    }
    else {
      ls_local._4_4_ = 0;
    }
    return ls_local._4_4_;
  }
  __assert_fail("set[2] == \'\\0\'",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,0xdb,"int check_next2(LexState *, const char *)");
}

Assistant:

static int check_next2 (LexState *ls, const char *set) {
  lua_assert(set[2] == '\0');
  if (ls->current == set[0] || ls->current == set[1]) {
    save_and_next(ls);
    return 1;
  }
  else return 0;
}